

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O0

error_or<pstore::repo::section_content_*> * __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::content_object(error_or<pstore::repo::section_content_*> *__return_storage_ptr__,
                generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                *this)

{
  section_kind sVar1;
  ulong uVar2;
  uint64_t uVar3;
  bool bVar4;
  byte bVar5;
  section_content *psVar6;
  iterator this_00;
  iterator first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> in_R8;
  maybe<std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>,_void> local_58;
  reference local_48;
  reference local_38;
  reference local_28;
  generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *local_18;
  generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *this_local;
  
  local_18 = this;
  this_local = (generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                *)__return_storage_ptr__;
  std::bitset<4UL>::operator[]((bitset<4UL> *)&local_28,(size_t)&this->seen_);
  std::bitset<4UL>::reference::operator=(&local_28,true);
  std::bitset<4UL>::reference::~reference(&local_28);
  std::bitset<4UL>::operator[]((bitset<4UL> *)&local_38,(size_t)&this->seen_);
  std::bitset<4UL>::reference::operator=(&local_38,true);
  std::bitset<4UL>::reference::~reference(&local_38);
  std::bitset<4UL>::operator[]((bitset<4UL> *)&local_48,(size_t)&this->seen_);
  std::bitset<4UL>::reference::operator=(&local_48,true);
  std::bitset<4UL>::reference::~reference(&local_48);
  bVar4 = std::bitset<4UL>::all(&this->seen_);
  if (bVar4) {
    bVar4 = is_power_of_two<unsigned_long,std::enable_if<true,void>>(this->align_);
    if (bVar4) {
      uVar2 = this->align_;
      bVar5 = std::numeric_limits<unsigned_char>::max();
      if (bVar5 < uVar2) {
        error_or<pstore::repo::section_content*>::error_or<pstore::exchange::import_ns::error,void>
                  ((error_or<pstore::repo::section_content*> *)__return_storage_ptr__,
                   alignment_is_too_great);
      }
      else {
        sVar1 = this->kind_;
        psVar6 = gsl::not_null<pstore::repo::section_content_*>::operator->(&this->content_);
        psVar6->kind = sVar1;
        uVar3 = this->align_;
        psVar6 = gsl::not_null<pstore::repo::section_content_*>::operator->(&this->content_);
        psVar6->align = (uint8_t)uVar3;
        this_00 = std::begin<std::__cxx11::string>(&this->data_);
        first = std::end<std::__cxx11::string>(&this->data_);
        psVar6 = gsl::not_null<pstore::repo::section_content_*>::operator->(&this->content_);
        last._M_current =
             (char *)std::back_inserter<pstore::small_vector<unsigned_char,128ul>>(&psVar6->data);
        from_base64<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
                  (&local_58,(pstore *)this_00._M_current,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )first._M_current,last,in_R8);
        bVar4 = pstore::maybe::operator_cast_to_bool((maybe *)&local_58);
        maybe<std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>,_void>::~maybe
                  (&local_58);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          error_or<pstore::repo::section_content*>::
          error_or<pstore::gsl::not_null<pstore::repo::section_content*>const&,void>
                    ((error_or<pstore::repo::section_content*> *)__return_storage_ptr__,
                     &this->content_);
        }
        else {
          error_or<pstore::repo::section_content*>::
          error_or<pstore::exchange::import_ns::error,void>
                    ((error_or<pstore::repo::section_content*> *)__return_storage_ptr__,
                     bad_base64_data);
        }
      }
    }
    else {
      error_or<pstore::repo::section_content*>::error_or<pstore::exchange::import_ns::error,void>
                ((error_or<pstore::repo::section_content*> *)__return_storage_ptr__,
                 alignment_must_be_power_of_2);
    }
  }
  else {
    error_or<pstore::repo::section_content*>::error_or<pstore::exchange::import_ns::error,void>
              ((error_or<pstore::repo::section_content*> *)__return_storage_ptr__,
               generic_section_was_incomplete);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<repo::section_content *> generic_section<OutputIterator>::content_object () {
                using return_type = error_or<repo::section_content *>;

                // The alignment field may be omitted if it is 1.
                seen_[align] = true;
                // We allow either or both of the internal and external fixup keys to be omitted if
                // their respective contents are empty.
                seen_[ifixups] = true;
                seen_[xfixups] = true;

                // Issue an error is any of the required fields were missing.
                if (!seen_.all ()) {
                    return return_type{error::generic_section_was_incomplete};
                }
                if (!is_power_of_two (align_)) {
                    return return_type{error::alignment_must_be_power_of_2};
                }
                using align_type = decltype (content_->align);
                static_assert (std::is_unsigned<align_type>::value,
                               "Expected alignment to be unsigned");
                if (align_ > std::numeric_limits<align_type>::max ()) {
                    return return_type{error::alignment_is_too_great};
                }
                content_->kind = kind_;
                content_->align = static_cast<align_type> (align_);
                if (!from_base64 (std::begin (data_), std::end (data_),
                                  std::back_inserter (content_->data))) {
                    return return_type{error::bad_base64_data};
                }
                return return_type{content_};
            }